

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flicker_remover.cxx
# Opt level: O0

void __thiscall FlickerRemover::reset(FlickerRemover *this)

{
  int iVar1;
  int iVar2;
  UMat *pUVar3;
  Scalar_<double> local_140;
  uint local_11c;
  undefined1 local_118 [4];
  uint j_2;
  uint local_f4;
  undefined1 local_f0 [4];
  uint j_1;
  int local_d0;
  uint local_cc;
  undefined1 local_c8 [4];
  uint j;
  _InputArray local_a8;
  Scalar_<double> local_90;
  _InputArray local_70;
  Scalar_<double> local_48;
  _InputArray local_28;
  FlickerRemover *local_10;
  FlickerRemover *this_local;
  
  local_10 = this;
  clear(this);
  CircularBuffer<cv::UMat_*>::clear(&this->corresponding_frames_similarity_levels);
  CircularBuffer<cv::UMat_*>::clear(&this->adjacent_frames_similarity_levels);
  cv::Scalar_<double>::Scalar_(&local_48,0.0);
  cv::_InputArray::_InputArray<double,4,1>(&local_28,(Matx<double,_4,_1> *)&local_48);
  cv::noArray();
  cv::UMat::setTo((_InputArray *)&this->flicker_counter,&local_28);
  cv::_InputArray::~_InputArray(&local_28);
  cv::Scalar_<double>::Scalar_(&local_90,0.0);
  cv::_InputArray::_InputArray<double,4,1>(&local_70,(Matx<double,_4,_1> *)&local_90);
  cv::noArray();
  cv::UMat::setTo((_InputArray *)&this->corresponding_frames_similarity_sum,&local_70);
  cv::_InputArray::~_InputArray(&local_70);
  cv::Scalar_<double>::Scalar_((Scalar_<double> *)local_c8,0.0);
  cv::_InputArray::_InputArray<double,4,1>(&local_a8,(Matx<double,_4,_1> *)local_c8);
  cv::noArray();
  cv::UMat::setTo((_InputArray *)&this->adjacent_frames_similarity_sum,&local_a8);
  cv::_InputArray::~_InputArray(&local_a8);
  std::vector<cv::UMat,_std::allocator<cv::UMat>_>::clear(&this->masks);
  std::vector<cv::UMat,_std::allocator<cv::UMat>_>::reserve
            (&this->masks,(ulong)this->number_of_masks);
  for (local_cc = 0; local_cc < this->number_of_masks; local_cc = local_cc + 1) {
    local_d0 = 3;
    cv::Scalar_<double>::Scalar_((Scalar_<double> *)local_f0,0.0);
    std::vector<cv::UMat,std::allocator<cv::UMat>>::
    emplace_back<int_const&,int_const&,int,cv::Scalar_<double>>
              ((vector<cv::UMat,std::allocator<cv::UMat>> *)&this->masks,&this->frame_rows,
               &this->frame_cols,&local_d0,(Scalar_<double> *)local_f0);
  }
  this->actual_mask = this->number_of_masks;
  for (local_f4 = 0; local_f4 < this->block_size; local_f4 = local_f4 + 1) {
    pUVar3 = (UMat *)operator_new(0x50);
    iVar1 = this->frame_rows;
    iVar2 = this->frame_cols;
    cv::Scalar_<double>::Scalar_((Scalar_<double> *)local_118,0.0);
    cv::UMat::UMat(pUVar3,iVar1,iVar2,0,local_118);
    CircularBuffer<cv::UMat_*>::push(&this->corresponding_frames_similarity_levels,pUVar3);
  }
  for (local_11c = 0; local_11c < this->block_size - 1; local_11c = local_11c + 1) {
    pUVar3 = (UMat *)operator_new(0x50);
    iVar1 = this->frame_rows;
    iVar2 = this->frame_cols;
    cv::Scalar_<double>::Scalar_(&local_140,0.0);
    cv::UMat::UMat(pUVar3,iVar1,iVar2,0,&local_140);
    CircularBuffer<cv::UMat_*>::push(&this->adjacent_frames_similarity_levels,pUVar3);
  }
  CircularBuffer<cv::UMat_*>::clear(&this->frames_block);
  return;
}

Assistant:

void FlickerRemover::reset()
{
    clear();
    corresponding_frames_similarity_levels.clear();
    adjacent_frames_similarity_levels.clear();
    flicker_counter.setTo(Scalar(0));
    corresponding_frames_similarity_sum.setTo(Scalar(0));
    adjacent_frames_similarity_sum.setTo(Scalar(0));
    masks.clear();
    masks.reserve(number_of_masks);
    for(unsigned int j = 0; j < number_of_masks; j++) {
        masks.emplace_back(frame_rows, frame_cols, CV_16S, Scalar(0));
    }
    actual_mask = number_of_masks;
    for(unsigned int j = 0; j < block_size; j++) {
        corresponding_frames_similarity_levels.push(new UMat(frame_rows, frame_cols, CV_8UC1, Scalar(0)));
    }
    for(unsigned int j = 0; j < block_size - 1; j++) {
        adjacent_frames_similarity_levels.push(new UMat(frame_rows, frame_cols, CV_8UC1, Scalar(0)));
    }
    frames_block.clear();
}